

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityAssociation.cpp
# Opt level: O0

bool __thiscall DIS::EntityAssociation::operator==(EntityAssociation *this,EntityAssociation *rhs)

{
  bool bVar1;
  bool local_19;
  bool ivarsEqual;
  EntityAssociation *rhs_local;
  EntityAssociation *this_local;
  
  local_19 = this->_changeIndicator == rhs->_changeIndicator &&
             this->_recordType == rhs->_recordType;
  if (this->_associationStatus != rhs->_associationStatus) {
    local_19 = false;
  }
  if (this->_associationType != rhs->_associationType) {
    local_19 = false;
  }
  bVar1 = EntityID::operator==(&this->_entityID,&rhs->_entityID);
  if (!bVar1) {
    local_19 = false;
  }
  if (this->_owsSttionLocation != rhs->_owsSttionLocation) {
    local_19 = false;
  }
  if (this->_physicalConnectionType != rhs->_physicalConnectionType) {
    local_19 = false;
  }
  if (this->_groupMemberType != rhs->_groupMemberType) {
    local_19 = false;
  }
  if (this->_groupNumber != rhs->_groupNumber) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool EntityAssociation::operator ==(const EntityAssociation& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_recordType == rhs._recordType) ) ivarsEqual = false;
     if( ! (_changeIndicator == rhs._changeIndicator) ) ivarsEqual = false;
     if( ! (_associationStatus == rhs._associationStatus) ) ivarsEqual = false;
     if( ! (_associationType == rhs._associationType) ) ivarsEqual = false;
     if( ! (_entityID == rhs._entityID) ) ivarsEqual = false;
     if( ! (_owsSttionLocation == rhs._owsSttionLocation) ) ivarsEqual = false;
     if( ! (_physicalConnectionType == rhs._physicalConnectionType) ) ivarsEqual = false;
     if( ! (_groupMemberType == rhs._groupMemberType) ) ivarsEqual = false;
     if( ! (_groupNumber == rhs._groupNumber) ) ivarsEqual = false;

    return ivarsEqual;
 }